

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uregex.cpp
# Opt level: O2

int32_t icu_63::RegexCImpl::appendTail
                  (RegularExpression *regexp,UChar **destBuf,int32_t *destCapacity,
                  UErrorCode *status)

{
  uint destCapacity_00;
  UChar *dest;
  RegexMatcher *pRVar1;
  UErrorCode UVar2;
  bool bVar3;
  UBool UVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int64_t start;
  UErrorCode UVar9;
  UErrorCode newStatus;
  
  bVar3 = true;
  if (((destCapacity != (int32_t *)0x0) && (*status == U_BUFFER_OVERFLOW_ERROR)) &&
     (*destCapacity == 0)) {
    *status = U_ZERO_ERROR;
    bVar3 = false;
  }
  UVar9 = U_ILLEGAL_ARGUMENT_ERROR;
  UVar4 = validateRE(regexp,'\x01',status);
  if (UVar4 == '\0') {
    return 0;
  }
  uVar5 = 0;
  if (destBuf == (UChar **)0x0 || destCapacity == (int32_t *)0x0) goto LAB_0015f8f2;
  dest = *destBuf;
  destCapacity_00 = *destCapacity;
  if (0 < (int)destCapacity_00 && dest == (UChar *)0x0 || (int)destCapacity_00 < 0)
  goto LAB_0015f8f2;
  pRVar1 = regexp->fMatcher;
  if (regexp->fText == (UChar *)0x0) {
    if (pRVar1->fMatch == '\0') {
      start = 0;
      if (pRVar1->fLastMatchEnd != -1) {
        start = pRVar1->fLastMatchEnd;
      }
    }
    else {
      start = pRVar1->fMatchEnd;
    }
    uVar5 = utext_extract_63(pRVar1->fInputText,start,pRVar1->fInputLength,dest,destCapacity_00,
                             status);
    uVar6 = (ulong)uVar5;
  }
  else {
    uVar6 = pRVar1->fSmallData[(ulong)(pRVar1->fMatch == '\0') - 7];
    if (uVar6 == 0xffffffffffffffff) {
      uVar6 = 0;
    }
    else if (pRVar1->fInputText->pFuncs->mapNativeIndexToUTF16 != (UTextMapNativeIndexToUTF16 *)0x0)
    {
      newStatus = U_ZERO_ERROR;
      uVar5 = utext_extract_63(pRVar1->fInputText,0,uVar6,(UChar *)0x0,0,&newStatus);
      uVar6 = (ulong)uVar5;
    }
    iVar7 = regexp->fTextLength;
    iVar8 = (int)uVar6;
    for (uVar6 = 0; (long)iVar7 - (long)iVar8 != uVar6; uVar6 = uVar6 + 1) {
      if ((iVar7 == -1) && (regexp->fText[(long)iVar8 + uVar6] == L'\0')) {
        regexp->fTextLength = iVar8 + (int)uVar6;
        break;
      }
      if (uVar6 < destCapacity_00) {
        dest[uVar6] = regexp->fText[(long)iVar8 + uVar6];
      }
      else if (0 < iVar7) {
        uVar6 = (ulong)(uint)(iVar7 - iVar8);
        break;
      }
    }
  }
  UVar9 = U_BUFFER_OVERFLOW_ERROR;
  uVar5 = (uint)uVar6;
  if ((int)uVar5 < (int)destCapacity_00) {
    dest[(int)uVar5] = L'\0';
    *destBuf = *destBuf + (int)uVar5;
    iVar7 = *destCapacity - uVar5;
LAB_0015fa34:
    *destCapacity = iVar7;
  }
  else {
    UVar2 = U_STRING_NOT_TERMINATED_WARNING;
    if (uVar5 != destCapacity_00) {
      UVar2 = UVar9;
    }
    *status = UVar2;
    if (*destBuf != (UChar *)0x0) {
      *destBuf = *destBuf + destCapacity_00;
      iVar7 = 0;
      goto LAB_0015fa34;
    }
  }
  if (bVar3) {
    return uVar5;
  }
  if (U_ZERO_ERROR < *status) {
    return uVar5;
  }
LAB_0015f8f2:
  *status = UVar9;
  return uVar5;
}

Assistant:

int32_t RegexCImpl::appendTail(RegularExpression    *regexp,
                               UChar                **destBuf,
                               int32_t               *destCapacity,
                               UErrorCode            *status)
{

    // If we come in with a buffer overflow error, don't suppress the operation.
    //  A series of appendReplacements, appendTail need to correctly preflight
    //  the buffer size when an overflow happens somewhere in the middle.
    UBool pendingBufferOverflow = FALSE;
    if (*status == U_BUFFER_OVERFLOW_ERROR && destCapacity != NULL && *destCapacity == 0) {
        pendingBufferOverflow = TRUE;
        *status = U_ZERO_ERROR;
    }

    if (validateRE(regexp, TRUE, status) == FALSE) {
        return 0;
    }

    if (destCapacity == NULL || destBuf == NULL ||
        (*destBuf == NULL && *destCapacity > 0) ||
        *destCapacity < 0)
    {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    RegexMatcher *m = regexp->fMatcher;

    int32_t  destIdx     = 0;
    int32_t  destCap     = *destCapacity;
    UChar    *dest       = *destBuf;

    if (regexp->fText != NULL) {
        int32_t srcIdx;
        int64_t nativeIdx = (m->fMatch ? m->fMatchEnd : m->fLastMatchEnd);
        if (nativeIdx == -1) {
            srcIdx = 0;
        } else if (UTEXT_USES_U16(m->fInputText)) {
            srcIdx = (int32_t)nativeIdx;
        } else {
            UErrorCode newStatus = U_ZERO_ERROR;
            srcIdx = utext_extract(m->fInputText, 0, nativeIdx, NULL, 0, &newStatus);
        }

        for (;;) {
            U_ASSERT(destIdx >= 0);

            if (srcIdx == regexp->fTextLength) {
                break;
            }
            UChar c = regexp->fText[srcIdx];
            if (c == 0 && regexp->fTextLength == -1) {
                regexp->fTextLength = srcIdx;
                break;
            }

            if (destIdx < destCap) {
                dest[destIdx] = c;
            } else {
                // We've overflowed the dest buffer.
                //  If the total input string length is known, we can
                //    compute the total buffer size needed without scanning through the string.
                if (regexp->fTextLength > 0) {
                    destIdx += (regexp->fTextLength - srcIdx);
                    break;
                }
            }
            srcIdx++;
            destIdx++;
        }
    } else {
        int64_t  srcIdx;
        if (m->fMatch) {
            // The most recent call to find() succeeded.
            srcIdx = m->fMatchEnd;
        } else {
            // The last call to find() on this matcher failed().
            //   Look back to the end of the last find() that succeeded for src index.
            srcIdx = m->fLastMatchEnd;
            if (srcIdx == -1)  {
                // There has been no successful match with this matcher.
                //   We want to copy the whole string.
                srcIdx = 0;
            }
        }

        destIdx = utext_extract(m->fInputText, srcIdx, m->fInputLength, dest, destCap, status);
    }

    //
    //  NUL terminate the output string, if possible, otherwise issue the
    //   appropriate error or warning.
    //
    if (destIdx < destCap) {
        dest[destIdx] = 0;
    } else  if (destIdx == destCap) {
        *status = U_STRING_NOT_TERMINATED_WARNING;
    } else {
        *status = U_BUFFER_OVERFLOW_ERROR;
    }

    //
    // Update the user's buffer ptr and capacity vars to reflect the
    //   amount used.
    //
    if (destIdx < destCap) {
        *destBuf      += destIdx;
        *destCapacity -= destIdx;
    } else if (*destBuf != NULL) {
        *destBuf      += destCap;
        *destCapacity  = 0;
    }

    if (pendingBufferOverflow && U_SUCCESS(*status)) {
        *status = U_BUFFER_OVERFLOW_ERROR;
    }

    return destIdx;
}